

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder,DtoaMode mode)

{
  bool bVar1;
  int digits_after_point;
  bool sign;
  int decimal_rep_length;
  int decimal_point;
  char decimal_rep [18];
  bool local_49;
  int local_48;
  int local_44;
  double local_40;
  char local_38 [32];
  
  if (SHORTEST_SINGLE < mode) {
    __assert_fail("mode == SHORTEST || mode == SHORTEST_SINGLE",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0xa5,
                  "bool FIX::double_conversion::DoubleToStringConverter::ToShortestIeeeNumber(double, StringBuilder *, DoubleToStringConverter::DtoaMode) const"
                 );
  }
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  local_40 = value;
  DoubleToAscii(value,mode,0,local_38,0x12,&local_49,&local_48,&local_44);
  if ((local_49 == true) && (local_40 != 0.0 || (this->flags_ & 8U) == 0)) {
    StringBuilder::AddCharacter(result_builder,'-');
  }
  if ((this->decimal_in_shortest_low_ < local_44) && (local_44 <= this->decimal_in_shortest_high_))
  {
    digits_after_point = 0;
    if (0 < local_48 - local_44) {
      digits_after_point = local_48 - local_44;
    }
    CreateDecimalRepresentation(this,local_38,local_48,local_44,digits_after_point,result_builder);
  }
  else {
    CreateExponentialRepresentation(this,local_38,local_48,local_44 + -1,result_builder);
  }
  return true;
}

Assistant:

bool DoubleToStringConverter::ToShortestIeeeNumber(
    double value,
    StringBuilder* result_builder,
    DoubleToStringConverter::DtoaMode mode) const {
  ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE);
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  int decimal_point;
  bool sign;
  const int kDecimalRepCapacity = kBase10MaximalLength + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, mode, 0, decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = (flags_ & UNIQUE_ZERO) != 0;
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  if ((decimal_in_shortest_low_ <= exponent) &&
      (exponent < decimal_in_shortest_high_)) {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length,
                                decimal_point,
                                Max(0, decimal_rep_length - decimal_point),
                                result_builder);
  } else {
    CreateExponentialRepresentation(decimal_rep, decimal_rep_length, exponent,
                                    result_builder);
  }
  return true;
}